

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdesinfo.cpp
# Opt level: O2

bool __thiscall
jrtplib::RTCPSDESInfo::GetNextPrivateValue
          (RTCPSDESInfo *this,uint8_t **prefix,size_t *prefixlen,uint8_t **value,size_t *valuelen)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  p_Var1 = (this->curitem)._M_node;
  if (p_Var1 != (_List_node_base *)&this->privitems) {
    p_Var2 = p_Var1[1]._M_next;
    *prefixlen = (size_t)p_Var2[2]._M_prev;
    *prefix = (uint8_t *)p_Var2[2]._M_next;
    p_Var2 = (this->curitem)._M_node[1]._M_next;
    *valuelen = (size_t)p_Var2[1]._M_prev;
    *value = (uint8_t *)p_Var2[1]._M_next;
    (this->curitem)._M_node = ((this->curitem)._M_node)->_M_next;
  }
  return p_Var1 != (_List_node_base *)&this->privitems;
}

Assistant:

bool RTCPSDESInfo::GetNextPrivateValue(uint8_t **prefix,size_t *prefixlen,uint8_t **value,size_t *valuelen)
{
	if (curitem == privitems.end())
		return false;
	*prefix = (*curitem)->GetPrefix(prefixlen);
	*value = (*curitem)->GetInfo(valuelen);
	++curitem;
	return true;
}